

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::Bitstream::evaluateCast
          (ConstantValue *__return_storage_ptr__,Bitstream *this,Type *type,ConstantValue *value,
          SourceRange sourceRange,EvalContext *context,bool isImplicit)

{
  SourceRange range;
  SourceRange range_00;
  ConstantValue *type_00;
  bool bVar1;
  Diagnostic *pDVar2;
  size_t sVar3;
  const_iterator ppCVar4;
  const_iterator ppCVar5;
  const_iterator local_e0;
  const_iterator iter;
  bitwidth_t bitOffset;
  undefined1 local_c8 [8];
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  size_t targetWidth;
  size_t local_50;
  size_t dynamicSize;
  size_t srcSize;
  SourceLocation SStack_38;
  bool isImplicit_local;
  EvalContext *context_local;
  ConstantValue *value_local;
  Type *type_local;
  SourceRange sourceRange_local;
  ConstantValue *cv;
  
  SStack_38 = sourceRange.endLoc;
  sourceRange_local.startLoc = sourceRange.startLoc;
  srcSize._7_1_ = (byte)context & 1;
  context_local = (EvalContext *)type;
  value_local = (ConstantValue *)this;
  type_local = (Type *)value;
  sourceRange_local.endLoc = (SourceLocation)__return_storage_ptr__;
  dynamicSize = slang::ConstantValue::bitstreamWidth((ConstantValue *)type);
  local_50 = 0;
  if ((srcSize._7_1_ & 1) == 0) {
    local_50 = bitstreamCastRemainingSize<slang::ast::Type>((Type *)value_local,dynamicSize);
    if (dynamicSize < local_50) {
      range_00.endLoc = sourceRange_local.startLoc;
      range_00.startLoc = (SourceLocation)type_local;
      pDVar2 = EvalContext::addDiag((EvalContext *)SStack_38,(DiagCode)0x3000c,range_00);
      sVar3 = slang::ConstantValue::bitstreamWidth((ConstantValue *)context_local);
      pDVar2 = Diagnostic::operator<<(pDVar2,sVar3);
      ast::operator<<(pDVar2,(Type *)value_local);
      slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
      return __return_storage_ptr__;
    }
  }
  else {
    sVar3 = Type::bitstreamWidth((Type *)value_local);
    if (sVar3 < dynamicSize) {
      bVar1 = Type::isFixedSize((Type *)value_local);
      if (bVar1) {
        packed.stackBase._24_8_ = type_local;
        range.endLoc = sourceRange_local.startLoc;
        range.startLoc = (SourceLocation)type_local;
        pDVar2 = EvalContext::addDiag((EvalContext *)SStack_38,(DiagCode)0x2b0007,range);
        pDVar2 = Diagnostic::operator<<(pDVar2,sVar3);
        Diagnostic::operator<<(pDVar2,dynamicSize);
        slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
        return __return_storage_ptr__;
      }
      local_50 = dynamicSize - sVar3;
    }
  }
  SmallVector<slang::ConstantValue_*,_5UL>::SmallVector
            ((SmallVector<slang::ConstantValue_*,_5UL> *)local_c8);
  packBitstream((ConstantValue *)context_local,(SmallVectorBase<slang::ConstantValue_*> *)local_c8);
  iter._0_4_ = 0;
  local_e0 = std::cbegin<slang::SmallVector<slang::ConstantValue*,5ul>>
                       ((SmallVector<slang::ConstantValue_*,_5UL> *)local_c8);
  type_00 = value_local;
  ppCVar4 = std::cend<slang::SmallVector<slang::ConstantValue*,5ul>>
                      ((SmallVector<slang::ConstantValue_*,_5UL> *)local_c8);
  unpackBitstream(__return_storage_ptr__,(Type *)type_00,&local_e0,ppCVar4,(bitwidth_t *)&iter,
                  &local_50);
  ppCVar4 = local_e0;
  if (local_50 == 0) {
    if (((srcSize._7_1_ & 1) == 0) &&
       ((ppCVar5 = std::cend<slang::SmallVector<slang::ConstantValue*,5ul>>
                             ((SmallVector<slang::ConstantValue_*,_5UL> *)local_c8),
        ppCVar4 != ppCVar5 || ((int)iter != 0)))) {
      assert::assertFailed
                ("isImplicit || (iter == std::cend(packed) && !bitOffset)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                 ,0x1b9,
                 "static ConstantValue slang::ast::Bitstream::evaluateCast(const Type &, ConstantValue &&, SourceRange, EvalContext &, bool)"
                );
    }
    SmallVector<slang::ConstantValue_*,_5UL>::~SmallVector
              ((SmallVector<slang::ConstantValue_*,_5UL> *)local_c8);
    return __return_storage_ptr__;
  }
  assert::assertFailed
            ("!dynamicSize",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
             ,0x1b8,
             "static ConstantValue slang::ast::Bitstream::evaluateCast(const Type &, ConstantValue &&, SourceRange, EvalContext &, bool)"
            );
}

Assistant:

ConstantValue Bitstream::evaluateCast(const Type& type, ConstantValue&& value,
                                      SourceRange sourceRange, EvalContext& context,
                                      bool isImplicit) {
    auto srcSize = value.bitstreamWidth();
    size_t dynamicSize = 0;
    if (!isImplicit) { // Explicit bit-stream casting
        dynamicSize = bitstreamCastRemainingSize(type, srcSize);
        if (dynamicSize > srcSize) {
            context.addDiag(diag::ConstEvalBitstreamCastSize, sourceRange)
                << value.bitstreamWidth() << type;
            return nullptr;
        }
    }
    else { // implicit streaming concatenation conversion
        auto targetWidth = type.bitstreamWidth();
        if (targetWidth < srcSize) {
            if (type.isFixedSize()) {
                context.addDiag(diag::BadStreamSize, sourceRange) << targetWidth << srcSize;
                return nullptr;
            }
            dynamicSize = srcSize - targetWidth;
        }
    }

    SmallVector<ConstantValue*> packed;
    packBitstream(value, packed);

    bitwidth_t bitOffset = 0;
    auto iter = std::cbegin(packed);
    auto cv = unpackBitstream(type, iter, std::cend(packed), bitOffset, dynamicSize);
    ASSERT(!dynamicSize);
    ASSERT(isImplicit || (iter == std::cend(packed) && !bitOffset));
    return cv;
}